

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O2

bool crnlib::image_utils::compute_delta(image_u8 *dest,image_u8 *a,image_u8 *b,uint scale)

{
  uint uVar1;
  uint uVar2;
  color_quad<unsigned_char,_int> *pcVar3;
  color_quad<unsigned_char,_int> *pcVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  uint y;
  uint uVar8;
  color_quad_u8 cd;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_2c;
  
  if (a->m_width == b->m_width) {
    uVar8 = 0;
    if (a->m_height == b->m_height) {
      local_2c.m_u32 = 0xff000000;
      image<crnlib::color_quad<unsigned_char,_int>_>::resize
                (dest,a->m_width,a->m_height,0xffffffff,
                 (color_quad<unsigned_char,_int> *)&local_2c.field_0);
      for (; uVar8 < a->m_height; uVar8 = uVar8 + 1) {
        for (uVar5 = 0; uVar5 < a->m_width; uVar5 = uVar5 + 1) {
          uVar1 = a->m_pitch;
          pcVar3 = a->m_pPixels;
          uVar2 = b->m_pitch;
          pcVar4 = b->m_pPixels;
          for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
            iVar7 = ((uint)pcVar3[uVar1 * uVar8 + uVar5].field_0.c[lVar6] -
                    (uint)pcVar4[uVar2 * uVar8 + uVar5].field_0.c[lVar6]) * scale + 0x80;
            if (0xfe < iVar7) {
              iVar7 = 0xff;
            }
            if (iVar7 < 1) {
              iVar7 = 0;
            }
            cd.field_0.c[lVar6] = (uchar)iVar7;
          }
          dest->m_pPixels[dest->m_pitch * uVar8 + uVar5].field_0.field_0 =
               (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
                )cd.field_0;
        }
      }
      uVar8 = 1;
    }
  }
  else {
    uVar8 = 0;
  }
  return SUB41(uVar8,0);
}

Assistant:

bool compute_delta(image_u8& dest, image_u8& a, image_u8& b, uint scale) {
  if ((a.get_width() != b.get_width()) || (a.get_height() != b.get_height()))
    return false;

  dest.resize(a.get_width(), b.get_height());

  for (uint y = 0; y < a.get_height(); y++) {
    for (uint x = 0; x < a.get_width(); x++) {
      const color_quad_u8& ca = a(x, y);
      const color_quad_u8& cb = b(x, y);

      color_quad_u8 cd;
      for (uint c = 0; c < 4; c++) {
        int d = (ca[c] - cb[c]) * scale + 128;
        d = math::clamp(d, 0, 255);
        cd[c] = static_cast<uint8>(d);
      }

      dest(x, y) = cd;
    }
  }

  return true;
}